

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall mjs::print_visitor::operator()(print_visitor *this,array_literal_expression *e)

{
  __uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_> e_00;
  char *pcVar1;
  size_t i;
  ulong uVar2;
  
  std::operator<<(this->os_,'[');
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(e->elements_).
                            super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(e->elements_).
                            super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar2 = uVar2 + 1) {
    pcVar1 = "], ";
    if (uVar2 == 0) {
      pcVar1 = "\t";
    }
    std::operator<<(this->os_,pcVar1 + 1);
    e_00._M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
    super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
         (e->elements_).
         super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar2]._M_t.
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t;
    if ((_Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>)
        e_00._M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
        super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl != (expression *)0x0) {
      accept<mjs::print_visitor>
                ((expression *)
                 e_00._M_t.
                 super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                 super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,this);
    }
  }
  std::operator<<(this->os_,']');
  return;
}

Assistant:

void operator()(const array_literal_expression& e) {
        os_ << '[';
        const auto& es = e.elements();
        for (size_t i = 0; i < es.size(); ++i) {
            os_ << (i ? ", " : "");
            if (es[i]) {
                accept(*es[i], *this);
            }
        }
        os_ << ']';
    }